

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg3.c
# Opt level: O0

_Bool borg_read_unknown(void)

{
  _Bool _Var1;
  char *what;
  borg_item *item;
  int local_10;
  wchar_t n;
  wchar_t i;
  
  item._4_4_ = -1;
  for (local_10 = 0; local_10 < (int)(uint)z_info->pack_size; local_10 = local_10 + 1) {
    if (((borg_items[local_10].iqty != '\0') && (borg_items[local_10].tval == '\x19')) &&
       (borg_items[local_10].kind == 0)) {
      item._4_4_ = local_10;
    }
  }
  if (item._4_4_ < 0) {
    n._3_1_ = false;
  }
  else {
    _Var1 = no_light(player);
    if (_Var1) {
      n._3_1_ = false;
    }
    else if ((borg_skill[0x65] == 0) && (borg_skill[0x67] == 0)) {
      what = format("# Reading unknown scroll %s.",borg_items + item._4_4_);
      borg_note(what);
      borg_keypress(0x72);
      borg_keypress((int)"abcdefgimnopqrstuvwxyzABCDEFGHIJKLMNOPQRSTUVWXYZ"[item._4_4_]);
      borg_keypress(0xe000);
      goal_item = -1;
      goal_ware = -1;
      goal_shop = -1;
      n._3_1_ = true;
    }
    else {
      n._3_1_ = false;
    }
  }
  return n._3_1_;
}

Assistant:

bool borg_read_unknown(void)
{
    int i, n = -1;

    /* Scan the pack */
    for (i = 0; i < z_info->pack_size; i++) {
        borg_item* item = &borg_items[i];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* Require correct tval */
        if (item->tval != TV_SCROLL)
            continue;

        /* Skip aware items */
        if (item->kind)
            continue;

        /* Save this item */
        n = i;
    }

    /* None available */
    if (n < 0)
        return (false);

    /* Dark */
    if (no_light(player))
        return (false);

    /* Blind or Confused */
    if (borg_skill[BI_ISBLIND] || borg_skill[BI_ISCONFUSED])
        return (false);

    /* Log the message */
    borg_note(format("# Reading unknown scroll %s.", borg_items[n].desc));

    /* Perform the action */
    borg_keypress('r');
    borg_keypress(all_letters_nohjkl[n]);

    /* Incase it is ID scroll, ESCAPE out. */
    borg_keypress(ESCAPE);

    /* Hack -- Clear "shop" goals */
    goal_shop = goal_ware = goal_item = -1;

    /* Success */
    return (true);
}